

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void AdjustConfig(TidyDocImpl *doc)

{
  uint *puVar1;
  ulong uVar2;
  
  if (*(int *)((doc->config).value + 0x16) != 0) {
    prvTidySetOptionBool(doc,TidyEncloseBodyText,yes);
  }
  if (*(int *)((doc->config).value + 0x25) == 0) {
    prvTidySetOptionInt(doc,TidyIndentSpaces,0);
  }
  if ((doc->config).value[0x5d].v == 0) {
    prvTidySetOptionInt(doc,TidyWrapLen,0x7fffffff);
  }
  if (*(int *)((doc->config).value + 0x59) != 0) {
    puVar1 = &(doc->config).defined_tags;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
    prvTidyDefineTag(doc,tagtype_inline,"o:p");
  }
  if (*(int *)((doc->config).value + 0x67) != 0) {
    prvTidySetOptionBool(doc,TidyXhtmlOut,no);
  }
  if (*(int *)((doc->config).value + 0x62) != 0) {
    prvTidySetOptionBool(doc,TidyXmlOut,yes);
    prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
    prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
  }
  if (*(int *)((doc->config).value + 0x67) != 0) {
    prvTidySetOptionBool(doc,TidyXmlOut,yes);
    prvTidySetOptionBool(doc,TidyXmlPIs,yes);
  }
  uVar2 = (doc->config).value[0x3c].v;
  if (((0xb < uVar2) || ((0xe13UL >> (uVar2 & 0x3f) & 1) == 0)) &&
     (*(int *)((doc->config).value + 100) != 0)) {
    prvTidySetOptionBool(doc,TidyXmlDecl,yes);
  }
  if (*(int *)((doc->config).value + 100) != 0) {
    if ((doc->config).value[0x3c].v - 9 < 3) {
      prvTidySetOptionInt(doc,TidyOutputBOM,1);
    }
    prvTidySetOptionBool(doc,TidyQuoteAmpersand,yes);
    prvTidySetOptionBool(doc,TidyOmitOptionalTags,no);
    return;
  }
  return;
}

Assistant:

static void AdjustConfig( TidyDocImpl* doc )
{
    if ( cfgBool(doc, TidyEncloseBlockText) )
        TY_(SetOptionBool)( doc, TidyEncloseBodyText, yes );

    if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState )
        TY_(SetOptionInt)( doc, TidyIndentSpaces, 0 );

    /* disable wrapping */
    if ( cfg(doc, TidyWrapLen) == 0 )
        TY_(SetOptionInt)( doc, TidyWrapLen, 0x7FFFFFFF );

    /* Word 2000 needs o:p to be declared as inline */
    if ( cfgBool(doc, TidyWord2000) )
    {
        doc->config.defined_tags |= tagtype_inline;
        TY_(DefineTag)( doc, tagtype_inline, "o:p" );
    }

    /* #480701 disable XHTML output flag if both output-xhtml and xml input are set */
    if ( cfgBool(doc, TidyXmlTags) )
        TY_(SetOptionBool)( doc, TidyXhtmlOut, no );

    /* XHTML is written in lower case */
    if ( cfgBool(doc, TidyXhtmlOut) )
    {
        TY_(SetOptionBool)( doc, TidyXmlOut, yes );
        TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
        TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
        /* TY_(SetOptionBool)( doc, TidyXmlPIs, yes ); */
    }

    /* if XML in, then XML out */
    if ( cfgBool(doc, TidyXmlTags) )
    {
        TY_(SetOptionBool)( doc, TidyXmlOut, yes );
        TY_(SetOptionBool)( doc, TidyXmlPIs, yes );
    }

    /* #427837 - fix by Dave Raggett 02 Jun 01
    ** generate <?xml version="1.0" encoding="iso-8859-1"?>
    ** if the output character encoding is Latin-1 etc.
    */
    if ( cfg(doc, TidyOutCharEncoding) != ASCII &&
         cfg(doc, TidyOutCharEncoding) != UTF8 &&
         cfg(doc, TidyOutCharEncoding) != UTF16 &&
         cfg(doc, TidyOutCharEncoding) != UTF16BE &&
         cfg(doc, TidyOutCharEncoding) != UTF16LE &&
         cfg(doc, TidyOutCharEncoding) != RAW &&
         cfgBool(doc, TidyXmlOut) )
    {
        TY_(SetOptionBool)( doc, TidyXmlDecl, yes );
    }

    /* XML requires end tags */
    if ( cfgBool(doc, TidyXmlOut) )
    {
        /* XML requires a BOM on output if using UTF-16 encoding */
        ulong enc = cfg( doc, TidyOutCharEncoding );
        if ( enc == UTF16LE || enc == UTF16BE || enc == UTF16 )
            TY_(SetOptionInt)( doc, TidyOutputBOM, yes );
        
        TY_(SetOptionBool)( doc, TidyQuoteAmpersand, yes );
        TY_(SetOptionBool)( doc, TidyOmitOptionalTags, no );
    }
}